

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O3

int __thiscall rudp::session::connect(session *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  _Any_data *this_00;
  undefined8 uVar1;
  bool bVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar3;
  undefined8 *puVar4;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  int in_R8D;
  undefined8 *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  undefined1 local_68 [24];
  socket *psStack_50;
  undefined1 local_48 [24];
  code *local_30;
  
  this->client = true;
  generate_syn((session *)local_68,SUB81(this,0));
  local_68._16_8_ = this;
  std::__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rudp::session,void>
            ((__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2> *)&psStack_50,
             (__weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2> *)this);
  this_00 = (_Any_data *)(local_48 + 8);
  std::function<void_(bool,_unsigned_int)>::function
            ((function<void_(bool,_unsigned_int)> *)this_00,
             (function<void_(bool,_unsigned_int)> *)CONCAT44(in_register_00000034,__fd));
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88 = (undefined8 *)0x0;
  uStack_80 = 0;
  puVar4 = (undefined8 *)operator_new(0x38);
  uVar1 = local_48._0_8_;
  *puVar4 = local_68._16_8_;
  puVar4[1] = psStack_50;
  local_48._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar4[2] = uVar1;
  psStack_50 = (socket *)0x0;
  std::function<void_(bool,_unsigned_int)>::function
            ((function<void_(bool,_unsigned_int)> *)(puVar4 + 3),
             (function<void_(bool,_unsigned_int)> *)this_00);
  pcStack_70 = std::
               _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:123:41)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:123:41)>
             ::_M_manager;
  local_88 = puVar4;
  send(this,(int)local_68,(void *)0x0,(size_t)&local_88,in_R8D);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  if (local_30 != (code *)0x0) {
    bVar2 = (*local_30)(this_00,this_00,__destroy_functor);
    local_30 = (code *)CONCAT71(extraout_var,bVar2);
  }
  iVar3 = (int)local_30;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._0_8_);
    iVar3 = extraout_EAX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    iVar3 = extraout_EAX_00;
  }
  return iVar3;
}

Assistant:

void session::connect( const std::function< void( bool, uint32_t ) > &cb ) {
    client = true;
    send( generate_syn( false ), false, [this,this_=shared_from_this(),cb]( bool status ) {
      cb( status, self_config.connection_identifier );
    } );
  }